

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O0

void __thiscall Experiments::InitBuffer(Experiments *this,int count)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  uint local_18;
  uint i;
  int count_local;
  Experiments *this_local;
  
  if ((this->buffer != (uint *)0x0) && (this->buffer != (uint *)0x0)) {
    operator_delete__(this->buffer);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)count;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (uint *)operator_new__(uVar3);
  this->buffer = puVar4;
  for (local_18 = 0; local_18 < (uint)count; local_18 = local_18 + 1) {
    iVar2 = rand();
    this->buffer[local_18] = iVar2 % count;
  }
  return;
}

Assistant:

void Experiments::InitBuffer(int count) {
    if (buffer != nullptr)
        delete[] buffer;
    buffer = new unsigned int[count];
    for (unsigned int i = 0; i < (unsigned int)count; i++)
        buffer[i] = rand() % count;
}